

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O2

int AF_A_SpawnBishop(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  uint32 *obj;
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *mobj;
  AActor *pAVar3;
  DObject *this_00;
  char *__assertion;
  FName local_3c;
  DVector3 local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053cf95;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_0053ce5d:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053cf95;
        }
      }
      if (numparam == 1) goto LAB_0053cedd;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053cf85;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053cf95;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053cf85;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053cedd:
        FName::FName(&local_3c,"Bishop");
        local_38.X = *(double *)&this_00[1].ObjectFlags;
        local_38.Y = (double)this_00[2]._vptr_DObject;
        local_38.Z = (double)this_00[2].Class;
        mobj = Spawn(&local_3c,&local_38,ALLOW_REPLACE);
        if (mobj != (AActor *)0x0) {
          bVar2 = P_TestMobjLocation(mobj);
          if (bVar2) {
            obj = &this_00[0xb].ObjectFlags;
            pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
            if (pAVar3 != (AActor *)0x0) {
              pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
              AActor::CopyFriendliness(mobj,pAVar3,true,true);
              (mobj->master).field_0.p = *(AActor **)obj;
            }
          }
          else {
            AActor::ClearCounters(mobj);
            (*(mobj->super_DThinker).super_DObject._vptr_DObject[4])(mobj);
          }
        }
        (*this_00->_vptr_DObject[4])(this_00);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053cf95;
    }
    if (this_00 == (DObject *)0x0) goto LAB_0053ce5d;
  }
LAB_0053cf85:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053cf95:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x352,"int AF_A_SpawnBishop(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnBishop)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	mo = Spawn("Bishop", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		if (!P_TestMobjLocation(mo))
		{
			mo->ClearCounters();
			mo->Destroy ();
		}
		else if (self->target != NULL)
		{ // [RH] Make the new bishops inherit the Heriarch's target
			mo->CopyFriendliness (self->target, true);
			mo->master = self->target;
		}
	}
	self->Destroy ();
	return 0;
}